

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O2

cbtCollisionObject * __thiscall
cbtCollisionWorldImporter::createCollisionObject
          (cbtCollisionWorldImporter *this,cbtTransform *startTransform,cbtCollisionShape *shape,
          char *bodyName)

{
  undefined8 uVar1;
  anon_union_8_2_511b660c_for_cbtHashPtr_0 this_00;
  cbtCollisionObject *colObj;
  char *newname;
  anon_union_8_2_511b660c_for_cbtHashPtr_0 local_50 [5];
  
  this_00.m_pointer = cbtCollisionObject::operator_new(0x178);
  cbtCollisionObject::cbtCollisionObject((cbtCollisionObject *)this_00.m_pointer);
  *(int *)((long)this_00.m_pointer + 0x160) = *(int *)((long)this_00.m_pointer + 0x160) + 1;
  uVar1 = *(undefined8 *)((startTransform->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(((cbtTransform *)((long)this_00.m_pointer + 8))->m_basis).m_el[0].m_floats =
       *(undefined8 *)(startTransform->m_basis).m_el[0].m_floats;
  *(undefined8 *)((long)this_00.m_pointer + 0x10) = uVar1;
  uVar1 = *(undefined8 *)((startTransform->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)((cbtVector3 *)((long)this_00.m_pointer + 0x18))->m_floats =
       *(undefined8 *)(startTransform->m_basis).m_el[1].m_floats;
  *(undefined8 *)((long)this_00.m_pointer + 0x20) = uVar1;
  uVar1 = *(undefined8 *)((startTransform->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)((cbtVector3 *)((long)this_00.m_pointer + 0x28))->m_floats =
       *(undefined8 *)(startTransform->m_basis).m_el[2].m_floats;
  *(undefined8 *)((long)this_00.m_pointer + 0x30) = uVar1;
  uVar1 = *(undefined8 *)((startTransform->m_origin).m_floats + 2);
  *(undefined8 *)((cbtVector3 *)((long)this_00.m_pointer + 0x38))->m_floats =
       *(undefined8 *)(startTransform->m_origin).m_floats;
  *(undefined8 *)((long)this_00.m_pointer + 0x40) = uVar1;
  colObj = (cbtCollisionObject *)this_00.m_pointer;
  (**(code **)(*this_00.m_pointer + 0x10))(this_00.m_pointer,shape);
  (*this->m_collisionWorld->_vptr_cbtCollisionWorld[9])
            (this->m_collisionWorld,this_00.m_pointer,1,0xffffffffffffffff);
  if (bodyName != (char *)0x0) {
    newname = duplicateName(this,bodyName);
    local_50[0].m_pointer = this_00.m_pointer;
    cbtHashMap<cbtHashPtr,_const_char_*>::insert
              (&this->m_objectNameMap,(cbtHashPtr *)local_50,&newname);
    cbtHashString::cbtHashString((cbtHashString *)local_50,newname);
    cbtHashMap<cbtHashString,_cbtCollisionObject_*>::insert
              (&this->m_nameColObjMap,(cbtHashString *)local_50,&colObj);
    std::__cxx11::string::~string((string *)local_50);
  }
  cbtAlignedObjectArray<cbtCollisionObject_*>::push_back(&this->m_allocatedCollisionObjects,&colObj)
  ;
  return colObj;
}

Assistant:

cbtCollisionObject* cbtCollisionWorldImporter::createCollisionObject(const cbtTransform& startTransform, cbtCollisionShape* shape, const char* bodyName)
{
	cbtCollisionObject* colObj = new cbtCollisionObject();
	colObj->setWorldTransform(startTransform);
	colObj->setCollisionShape(shape);
	m_collisionWorld->addCollisionObject(colObj);  //todo: flags etc

	if (bodyName)
	{
		char* newname = duplicateName(bodyName);
		m_objectNameMap.insert(colObj, newname);
		m_nameColObjMap.insert(newname, colObj);
	}
	m_allocatedCollisionObjects.push_back(colObj);

	return colObj;
}